

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

void deallocateVecOfIntVec(Vec_Ptr_t *vecOfIntVec)

{
  void *__ptr;
  void *__ptr_00;
  long lVar1;
  
  if (vecOfIntVec != (Vec_Ptr_t *)0x0) {
    if (0 < vecOfIntVec->nSize) {
      lVar1 = 0;
      do {
        __ptr = vecOfIntVec->pArray[lVar1];
        __ptr_00 = *(void **)((long)__ptr + 8);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        free(__ptr);
        lVar1 = lVar1 + 1;
      } while (lVar1 < vecOfIntVec->nSize);
    }
    if (vecOfIntVec->pArray != (void **)0x0) {
      free(vecOfIntVec->pArray);
    }
    free(vecOfIntVec);
    return;
  }
  return;
}

Assistant:

void deallocateVecOfIntVec( Vec_Ptr_t *vecOfIntVec )
{
	Vec_Int_t *vInt;
	int i;

	if( vecOfIntVec )
	{
		Vec_PtrForEachEntry( Vec_Int_t *, vecOfIntVec, vInt, i )
		{
			Vec_IntFree( vInt );
		}
		Vec_PtrFree(vecOfIntVec);
	}	
}